

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

void __thiscall
DnsStats::SubmitQueryExtensions
          (DnsStats *this,uint8_t *packet,uint32_t length,uint32_t name_offset,uint8_t *client_addr,
          size_t client_addr_length)

{
  BinHash<TldAsKey> *this_00;
  uint8_t *domain;
  byte bVar1;
  DnsStats *this_01;
  bool bVar2;
  TldAsKey *pTVar3;
  ulong uVar4;
  bool is_bad_syntax;
  bool is_numeric;
  bool is_binary;
  uint32_t tld_offset;
  uint32_t previous_offset;
  int nb_name_parts;
  TldAsKey key;
  bool local_c7;
  bool local_c6;
  bool local_c5;
  uint32_t local_c4;
  DnsStats *local_c0;
  uint8_t *local_b8;
  size_t local_b0;
  uint32_t local_a8 [2];
  TldAsKey local_a0;
  
  local_c4 = 0;
  local_a8[1] = 0;
  local_a8[0] = 0;
  bVar2 = GetTLD(packet,length,name_offset,&local_c4,local_a8,(int *)(local_a8 + 1));
  if (bVar2) {
    local_c5 = false;
    local_c7 = false;
    local_c6 = false;
    uVar4 = (ulong)local_c4;
    domain = packet + uVar4 + 1;
    bVar1 = domain[-1];
    local_c0 = this;
    local_b8 = client_addr;
    local_b0 = client_addr_length;
    TldCheck(domain,(ulong)bVar1,&local_c5,&local_c7,&local_c6);
    if ((local_c5 == false) && (local_c7 == false)) {
      SetToUpperCase(domain,(ulong)bVar1);
      TldAsKey::TldAsKey(&local_a0,domain,(ulong)packet[uVar4]);
      this_01 = local_c0;
      this_00 = &local_c0->registeredTld;
      if ((local_c0->registeredTld).tableCount == 0) {
        LoadRegisteredTLD_from_memory(local_c0);
      }
      pTVar3 = BinHash<TldAsKey>::Retrieve(this_00,&local_a0);
      if (pTVar3 != (TldAsKey *)0x0) {
        RegisterOptionsByIp(this_01,local_b8,local_b0);
      }
    }
  }
  return;
}

Assistant:

void DnsStats::SubmitQueryExtensions(
    uint8_t* packet, uint32_t length, uint32_t name_offset,
    uint8_t* client_addr, size_t client_addr_length)
{
    uint32_t tld_offset = 0;
    int nb_name_parts = 0;
    uint32_t previous_offset = 0;
    bool gotTld = GetTLD(packet, length, name_offset, &tld_offset, &previous_offset, &nb_name_parts);

    if (gotTld)
    {
        bool is_binary = false;
        bool is_bad_syntax = false;
        bool is_numeric = false;

        /* Verify that the TLD is valid, so as to exclude random traffic that would drown the stats */
        TldCheck(packet + tld_offset + 1, packet[tld_offset], &is_binary, &is_bad_syntax, &is_numeric);

        if (!is_binary && !is_bad_syntax) {
            SetToUpperCase(packet + tld_offset + 1, packet[tld_offset]);
            TldAsKey key(packet + tld_offset + 1, packet[tld_offset]);

            if (registeredTld.GetCount() == 0)
            {
                LoadRegisteredTLD_from_memory();
            }

            if (registeredTld.Retrieve(&key) != NULL)
            {
                /* This is a registered TLD
                 * Use the list of source addresses as a filter to
                 * check the incoming EDNS options */
                RegisterOptionsByIp(client_addr, client_addr_length);
            }
        }
    }
}